

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution3d.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution3D::forward(Convolution3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  reference pvVar8;
  float *pfVar9;
  undefined8 *in_RCX;
  long in_RSI;
  long in_RDI;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float wt;
  float val;
  int l;
  float *sptr;
  Mat m;
  int q;
  float *kptr;
  float sum;
  int j_1;
  int i_1;
  int z_1;
  float *outptr;
  int p;
  int j;
  int i;
  int z;
  int gap1;
  int gap0;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outd;
  int outh;
  int outw;
  Option opt_pad;
  Mat bottom_blob_bordered;
  int kernel_extend_d;
  int kernel_extend_h;
  int kernel_extend_w;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  undefined4 in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd08;
  float in_stack_fffffffffffffd0c;
  float in_stack_fffffffffffffd10;
  float in_stack_fffffffffffffd14;
  size_type in_stack_fffffffffffffd18;
  Mat *in_stack_fffffffffffffd20;
  Mat *in_stack_fffffffffffffd28;
  Allocator *in_stack_fffffffffffffd30;
  int local_27c;
  Mat local_278;
  Mat *local_230;
  int local_1dc;
  float *local_1d8;
  float local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  Option *in_stack_fffffffffffffe40;
  Mat *in_stack_fffffffffffffe48;
  Mat *in_stack_fffffffffffffe50;
  Convolution3D *in_stack_fffffffffffffe58;
  float *local_178;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_158;
  int local_154;
  vector<int,_std::allocator<int>_> local_140;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  undefined4 local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  ulong local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  Mat local_c0;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  undefined8 *local_50;
  int local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  Mat *local_10;
  undefined4 local_8;
  float local_4;
  undefined8 extraout_XMM0_Qb;
  
  local_54 = *(int *)(in_RSI + 0x2c);
  local_58 = *(int *)(in_RSI + 0x30);
  local_5c = *(int *)(in_RSI + 0x34);
  local_60 = *(int *)(in_RSI + 0x38);
  local_68 = *(undefined8 *)(in_RSI + 0x10);
  local_6c = *(int *)(in_RDI + 0xe0) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
  local_70 = *(int *)(in_RDI + 0xe4) * (*(int *)(in_RDI + 0xd8) + -1) + 1;
  local_74 = *(int *)(in_RDI + 0xe8) * (*(int *)(in_RDI + 0xdc) + -1) + 1;
  local_50 = in_RCX;
  ncnn::Mat::Mat(&local_c0);
  local_108 = *local_50;
  uStack_100 = local_50[1];
  local_f8 = *(undefined4 *)(local_50 + 2);
  uStack_f4 = *(undefined4 *)((long)local_50 + 0x14);
  uStack_f0 = *(undefined4 *)(local_50 + 3);
  uStack_ec = *(undefined4 *)((long)local_50 + 0x1c);
  uStack_e0 = local_50[5];
  local_d8 = local_50[6];
  uStack_d0 = local_50[7];
  local_e8 = local_50[4] & 0xffffffffffffff;
  make_padding(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe40);
  bVar7 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  if (bVar7) {
    local_30 = -100;
    local_118 = 1;
  }
  else {
    local_54 = local_c0.w;
    local_58 = local_c0.h;
    local_5c = local_c0.d;
    local_11c = (local_c0.w - local_6c) / *(int *)(in_RDI + 0xec) + 1;
    local_120 = (local_c0.h - local_70) / *(int *)(in_RDI + 0xf0) + 1;
    local_124 = (local_c0.d - local_74) / *(int *)(in_RDI + 0xf4) + 1;
    local_128 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8) * *(int *)(in_RDI + 0xdc);
    std::allocator<int>::allocator((allocator<int> *)0x981744);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd18,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    std::allocator<int>::~allocator((allocator<int> *)0x98176a);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_140,0);
    local_154 = 0;
    local_158 = 0;
    iVar1 = *(int *)(in_RDI + 0xe4);
    iVar2 = *(int *)(in_RDI + 0xd4);
    iVar3 = *(int *)(in_RDI + 0xe0);
    iVar4 = *(int *)(in_RDI + 0xe8);
    iVar5 = *(int *)(in_RDI + 0xd8);
    iVar6 = *(int *)(in_RDI + 0xe4);
    for (local_164 = 0; local_164 < *(int *)(in_RDI + 0xdc); local_164 = local_164 + 1) {
      for (local_168 = 0; local_168 < *(int *)(in_RDI + 0xd8); local_168 = local_168 + 1) {
        for (local_16c = 0; local_16c < *(int *)(in_RDI + 0xd4); local_16c = local_16c + 1) {
          pvVar8[local_154] = local_158;
          local_154 = local_154 + 1;
          local_158 = *(int *)(in_RDI + 0xe0) + local_158;
        }
        local_158 = (local_54 * iVar1 - iVar2 * iVar3) + local_158;
      }
      local_158 = (local_58 * local_54 * iVar4 - local_54 * iVar5 * iVar6) + local_158;
    }
    ncnn::Mat::create(in_stack_fffffffffffffd20,(int)(in_stack_fffffffffffffd18 >> 0x20),
                      (int)in_stack_fffffffffffffd18,(int)in_stack_fffffffffffffd14,
                      (int)in_stack_fffffffffffffd10,
                      CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                      in_stack_fffffffffffffd30);
    bVar7 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    if (bVar7) {
      local_30 = -100;
    }
    else {
      for (local_170 = 0; local_170 < *(int *)(in_RDI + 0xd0); local_170 = local_170 + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20)
                          );
        local_178 = ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xfffffffffffffe40);
        ncnn::Mat::~Mat((Mat *)0x981a2b);
        for (local_1c4 = 0; local_1c4 < local_124; local_1c4 = local_1c4 + 1) {
          for (local_1c8 = 0; local_1c8 < local_120; local_1c8 = local_1c8 + 1) {
            for (local_1cc = 0; local_1cc < local_11c; local_1cc = local_1cc + 1) {
              local_1d0 = 0.0;
              if (*(int *)(in_RDI + 0x114) != 0) {
                pfVar9 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x1b0),(long)local_170);
                local_1d0 = *pfVar9;
              }
              local_1d8 = ncnn::Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x168));
              local_1d8 = local_1d8 + local_128 * local_60 * local_170;
              for (local_1dc = 0; local_1dc < local_60; local_1dc = local_1dc + 1) {
                ncnn::Mat::channel(in_stack_fffffffffffffd28,
                                   (int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
                ncnn::Mat::depth((Mat *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08
                                                ),in_stack_fffffffffffffd04);
                in_stack_fffffffffffffd28 =
                     (Mat *)ncnn::Mat::row(&local_278,local_1c8 * *(int *)(in_RDI + 0xf0));
                in_stack_fffffffffffffd20 =
                     (Mat *)((long)&in_stack_fffffffffffffd28->data +
                            (long)(local_1cc * *(int *)(in_RDI + 0xec)) * 4);
                ncnn::Mat::~Mat((Mat *)0x981c15);
                for (local_27c = 0; local_27c < local_128; local_27c = local_27c + 1) {
                  local_1d0 = *(float *)((long)&in_stack_fffffffffffffd20->data +
                                        (long)pvVar8[local_27c] * 4) * local_1d8[local_27c] +
                              local_1d0;
                }
                local_1d8 = local_1d8 + local_128;
                local_230 = in_stack_fffffffffffffd20;
                ncnn::Mat::~Mat((Mat *)0x981d2a);
              }
              local_8 = *(undefined4 *)(in_RDI + 0x11c);
              local_10 = (Mat *)(in_RDI + 0x120);
              local_4 = local_1d0;
              switch(local_8) {
              case 1:
                dVar10 = std::fmax((double)(ulong)(uint)local_1d0,0.0);
                local_4 = SUB84(dVar10,0);
                break;
              case 2:
                pfVar9 = ncnn::Mat::operator[](local_10,0);
                local_14 = *pfVar9;
                in_stack_fffffffffffffd14 = local_4;
                if (local_4 <= 0.0) {
                  local_4 = local_4 * local_14;
                  in_stack_fffffffffffffd14 = local_4;
                }
                break;
              case 3:
                pfVar9 = ncnn::Mat::operator[](local_10,0);
                local_18 = *pfVar9;
                pfVar9 = ncnn::Mat::operator[](local_10,1);
                local_1c = *pfVar9;
                if (local_4 < local_18) {
                  local_4 = local_18;
                }
                if (local_1c < local_4) {
                  local_4 = local_1c;
                }
                break;
              case 4:
                dVar10 = std::exp((double)(ulong)(uint)-local_1d0);
                local_4 = 1.0 / (SUB84(dVar10,0) + 1.0);
                break;
              case 5:
                in_stack_fffffffffffffd10 = local_1d0;
                auVar11._0_8_ = std::exp((double)(ulong)(uint)local_1d0);
                auVar11._8_8_ = extraout_XMM0_Qb;
                auVar12._4_12_ = auVar11._4_12_;
                auVar12._0_4_ = SUB84(auVar11._0_8_,0) + 1.0;
                dVar10 = std::log(auVar12._0_8_);
                dVar10 = std::tanh(dVar10);
                local_4 = in_stack_fffffffffffffd10 * SUB84(dVar10,0);
                break;
              case 6:
                pfVar9 = ncnn::Mat::operator[](local_10,0);
                local_20 = *pfVar9;
                pfVar9 = ncnn::Mat::operator[](local_10,1);
                local_24 = *pfVar9;
                local_28 = -local_24 / local_20;
                local_2c = 1.0 / local_20 + local_28;
                if (local_28 <= local_4) {
                  if (local_4 <= local_2c) {
                    local_4 = local_4 * (local_4 * local_20 + local_24);
                  }
                }
                else {
                  local_4 = 0.0;
                }
              }
              local_178[local_1cc] = local_4;
              in_stack_fffffffffffffd0c = local_4;
            }
            local_178 = local_178 + local_11c;
          }
        }
      }
      local_30 = 0;
    }
    local_118 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  }
  ncnn::Mat::~Mat((Mat *)0x98213b);
  return local_30;
}

Assistant:

int Convolution3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int z = 0; z < outd; z++)
        {
            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[p];

                    const float* kptr = (const float*)weight_data + maxk * channels * p;

                    for (int q = 0; q < channels; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(q);
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];

                            float wt = kptr[l];
                            sum += val * wt;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }

                outptr += outw;
            }
        }
    }

    return 0;
}